

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mftr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rt,int rd,int u,int sel,
             int h)

{
  TCGContext_conflict6 *s;
  TCGv_ptr pTVar1;
  uintptr_t o;
  TCGTemp *a1;
  TCGv_i64 arg;
  TCGTemp *ts;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  int iVar4;
  undefined4 in_register_00000014;
  uintptr_t o_1;
  int32_t iVar5;
  code *pcVar6;
  TCGv_i32 fp0;
  TCGTemp *args [1];
  TCGTemp *local_58;
  TCGTemp *local_50;
  ulong local_40;
  DisasContext_conflict6 *local_38;
  
  local_40 = CONCAT44(in_register_00000014,rt);
  s = ctx->uc->tcg_ctx;
  iVar5 = env->CP0_VPEControl;
  local_38 = ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
  arg = (TCGv_i64)((long)a1 - (long)s);
  if ((((env->CP0_VPEConf0 & 2) == 0) &&
      ((((env->active_tc).CP0_TCBind ^ env->tcs[(byte)iVar5].CP0_TCBind) & 0xfU) != 0)) ||
     ((byte)env->mvp->CP0_MVPConf0 < (byte)env->CP0_VPEControl)) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1,0xffffffffffffffff);
    goto LAB_009a297c;
  }
  if (u == 0) {
    switch((int)local_40) {
    case 1:
      if (sel == 2) {
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_vpeconf0_mips64el;
      }
      else {
        if (sel != 1) goto switchD_009a2265_default;
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_vpecontrol_mips64el;
      }
      break;
    case 2:
      switch(sel) {
      case 1:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tcstatus_mips64el;
        break;
      case 2:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tcbind_mips64el;
        break;
      case 3:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tcrestart_mips64el;
        break;
      case 4:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tchalt_mips64el;
        break;
      case 5:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tccontext_mips64el;
        break;
      case 6:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tcschedule_mips64el;
        break;
      case 7:
        local_58 = (TCGTemp *)(s->cpu_env + (long)s);
        pcVar6 = helper_mftc0_tcschefback_mips64el;
        break;
      default:
        iVar4 = 2;
        goto LAB_009a2581;
      }
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xb:
switchD_009a22c9_caseD_3:
      iVar4 = (int)local_40;
LAB_009a2581:
      gen_mfc0(local_38,arg,iVar4,sel);
      goto LAB_009a297c;
    case 10:
      if (sel != 0) {
        iVar4 = 10;
        goto LAB_009a2581;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_entryhi_mips64el;
      break;
    case 0xc:
      if (sel != 0) {
        iVar4 = 0xc;
        goto LAB_009a2581;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_status_mips64el;
      break;
    case 0xd:
      if (sel != 0) goto switchD_009a2265_default;
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_cause_mips64el;
      break;
    case 0xe:
      if (sel != 0) goto switchD_009a2265_default;
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_epc_mips64el;
      break;
    case 0xf:
      if (sel != 1) goto switchD_009a2265_default;
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_ebase_mips64el;
      break;
    case 0x10:
      if (7 < (uint)sel) goto switchD_009a2265_default;
      pTVar1 = s->cpu_env;
      pTVar3 = tcg_const_i64_mips64el(s,(ulong)(uint)sel);
      local_50 = (TCGTemp *)(pTVar3 + (long)s);
      pcVar6 = helper_mftc0_configx_mips64el;
      iVar4 = 2;
      local_58 = (TCGTemp *)(pTVar1 + (long)s);
      goto LAB_009a2977;
    default:
      if ((int)local_40 != 0x17) goto switchD_009a22c9_caseD_3;
      if (sel != 0) {
        iVar4 = 0x17;
        goto LAB_009a2581;
      }
      local_58 = (TCGTemp *)(s->cpu_env + (long)s);
      pcVar6 = helper_mftc0_debug_mips64el;
    }
LAB_009a296f:
    iVar4 = 1;
LAB_009a2977:
    tcg_gen_callN_mips64el(s,pcVar6,(TCGTemp *)(arg + (long)s),iVar4,&local_58);
    goto LAB_009a297c;
  }
  switch(sel) {
  case 0:
    pTVar2 = tcg_const_i32_mips64el(s,(int)local_40);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar6 = helper_mftgpr_mips64el;
    goto LAB_009a283e;
  case 1:
    break;
  case 2:
    ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar2 = (TCGv_i32)((long)ts - (long)s);
    if (h == 0) {
      gen_load_fpr32(local_38,pTVar2,(int)local_40);
    }
    else {
      gen_load_fpr32h(local_38,pTVar2,(int)local_40);
    }
    tcg_gen_ext_i32_i64_mips64el(s,arg,pTVar2);
    goto LAB_009a2851;
  case 3:
    pTVar2 = tcg_const_i32_mips64el(s,(int)local_40);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar6 = helper_cfc1_mips64el;
    goto LAB_009a283e;
  default:
switchD_009a2265_default:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
    generate_exception_err(local_38,0x14,0);
    return;
  }
  switch(local_40 & 0xffffffff) {
  case 0:
    iVar5 = 0;
    break;
  case 1:
    iVar5 = 0;
    goto LAB_009a278a;
  case 2:
    iVar5 = 0;
    goto LAB_009a280f;
  default:
    goto switchD_009a2265_default;
  case 4:
    iVar5 = 1;
    break;
  case 5:
    iVar5 = 1;
    goto LAB_009a278a;
  case 6:
    iVar5 = 1;
    goto LAB_009a280f;
  case 8:
    iVar5 = 2;
    break;
  case 9:
    iVar5 = 2;
    goto LAB_009a278a;
  case 10:
    iVar5 = 2;
    goto LAB_009a280f;
  case 0xc:
    iVar5 = 3;
    break;
  case 0xd:
    iVar5 = 3;
LAB_009a278a:
    pTVar2 = tcg_const_i32_mips64el(s,iVar5);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar6 = helper_mfthi_mips64el;
    goto LAB_009a283e;
  case 0xe:
    iVar5 = 3;
LAB_009a280f:
    pTVar2 = tcg_const_i32_mips64el(s,iVar5);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)(pTVar2 + (long)s);
    pcVar6 = helper_mftacx_mips64el;
    goto LAB_009a283e;
  case 0x10:
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    pcVar6 = helper_mftdsp_mips64el;
    goto LAB_009a296f;
  }
  pTVar2 = tcg_const_i32_mips64el(s,iVar5);
  local_58 = (TCGTemp *)(s->cpu_env + (long)s);
  local_50 = (TCGTemp *)(pTVar2 + (long)s);
  pcVar6 = helper_mftlo_mips64el;
LAB_009a283e:
  ts = local_50;
  tcg_gen_callN_mips64el(s,pcVar6,(TCGTemp *)(arg + (long)s),2,&local_58);
LAB_009a2851:
  tcg_temp_free_internal_mips64el(s,ts);
LAB_009a297c:
  if ((rd != 0) && (s->cpu_gpr[rd] != arg)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
  return;
}

Assistant:

static void gen_mftr(CPUMIPSState *env, DisasContext *ctx, int rt, int rd,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
               (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        tcg_gen_movi_tl(tcg_ctx, t0, -1);
    } else if (u == 0) {
        switch (rt) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mftc0_vpecontrol(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_vpeconf0(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mftc0_tcstatus(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 2:
                gen_helper_mftc0_tcbind(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 3:
                gen_helper_mftc0_tcrestart(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 4:
                gen_helper_mftc0_tchalt(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 5:
                gen_helper_mftc0_tccontext(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 6:
                gen_helper_mftc0_tcschedule(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            case 7:
                gen_helper_mftc0_tcschefback(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mftc0_entryhi(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mftc0_status(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mftc0_cause(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 14:
            switch (sel) {
            case 0:
                gen_helper_mftc0_epc(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mftc0_ebase(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 16:
            switch (sel) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
                gen_helper_mftc0_configx(tcg_ctx, t0, tcg_ctx->cpu_env, tcg_const_tl(tcg_ctx, sel));
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mftc0_debug(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                gen_mfc0(ctx, t0, rt, sel);
                break;
            }
            break;
        default:
            gen_mfc0(ctx, t0, rt, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_1e0i(mftgpr, t0, rt);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rt) {
            case 0:
                gen_helper_1e0i(mftlo, t0, 0);
                break;
            case 1:
                gen_helper_1e0i(mfthi, t0, 0);
                break;
            case 2:
                gen_helper_1e0i(mftacx, t0, 0);
                break;
            case 4:
                gen_helper_1e0i(mftlo, t0, 1);
                break;
            case 5:
                gen_helper_1e0i(mfthi, t0, 1);
                break;
            case 6:
                gen_helper_1e0i(mftacx, t0, 1);
                break;
            case 8:
                gen_helper_1e0i(mftlo, t0, 2);
                break;
            case 9:
                gen_helper_1e0i(mfthi, t0, 2);
                break;
            case 10:
                gen_helper_1e0i(mftacx, t0, 2);
                break;
            case 12:
                gen_helper_1e0i(mftlo, t0, 3);
                break;
            case 13:
                gen_helper_1e0i(mfthi, t0, 3);
                break;
            case 14:
                gen_helper_1e0i(mftacx, t0, 3);
                break;
            case 16:
                gen_helper_mftdsp(tcg_ctx, t0, tcg_ctx->cpu_env);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                gen_load_fpr32h(ctx, fp0, rt);
                tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            gen_helper_1e0i(cfc1, t0, rt);
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    gen_store_gpr(tcg_ctx, t0, rd);
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mftr (reg %d u %d sel %d h %d)\n", rt, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}